

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O1

void borg_free_track(borg_track *track)

{
  track->num = 0;
  track->size = 0;
  mem_free(track->x);
  track->x = (int *)0x0;
  mem_free(track->y);
  track->y = (int *)0x0;
  return;
}

Assistant:

void borg_free_track(struct borg_track *track)
{
    track->num  = 0;
    track->size = 0;
    mem_free(track->x);
    track->x = NULL;
    mem_free(track->y);
    track->y = NULL;
}